

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fct.h
# Opt level: O0

int fct_filter_pass(char *prefix,char *test_str)

{
  bool bVar1;
  char *local_38;
  char *test_str_p;
  char *prefix_p;
  int is_match;
  char *test_str_local;
  char *prefix_local;
  
  prefix_p._4_4_ = 0;
  if (test_str != (char *)0x0) {
    if ((prefix == (char *)0x0) || (local_38 = test_str, test_str_p = prefix, *prefix == '\0')) {
      prefix_local._4_4_ = 1;
    }
    else {
      while( true ) {
        bVar1 = false;
        if (*test_str_p != '\0') {
          bVar1 = *local_38 != '\0';
        }
        if ((!bVar1) || (prefix_p._4_4_ = (uint)(*test_str_p == *local_38), prefix_p._4_4_ == 0))
        break;
        test_str_p = test_str_p + 1;
        local_38 = local_38 + 1;
      }
      if ((*local_38 == '\0') && (*test_str_p != '\0')) {
        prefix_local._4_4_ = 0;
      }
      else {
        prefix_local._4_4_ = prefix_p._4_4_;
      }
    }
    return prefix_local._4_4_;
  }
  __assert_fail("test_str != ((void*)0)",
                "/workspace/llm4binary/github/license_c_cmakelists/imb[P]fctx/include/fct.h",0x163,
                "int fct_filter_pass(const char *, const char *)");
}

Assistant:

static nbool_t
fct_filter_pass(char const *prefix, char const *test_str)
{
    nbool_t is_match = FCT_FALSE;
    char const *prefix_p;
    char const *test_str_p;

    /* If you got nothing to test against, why test? */
    FCT_ASSERT( test_str != NULL );

    /* When the prefix is NULL or blank, we always return FCT_TRUE. */
    if ( prefix == NULL  || prefix[0] == '\0' )
    {
        return FCT_TRUE;
    }

    /* Iterate through both character arrays at the same time. We are
    going to play a game and see if we can beat the house. */
    for ( prefix_p = prefix, test_str_p = test_str;
            *prefix_p != '\0' && *test_str_p != '\0';
            ++prefix_p, ++test_str_p )
    {
        is_match = *prefix_p == *test_str_p;
        if ( !is_match )
        {
            break;   /* Quit the first time we don't match. */
        }
    }

    /* If the iterator for the test_str is pointing at the null char, and
    the iterator for the prefix string is not, then the prefix string is
    larger than the actual test string, and therefore we failed to pass the
    filter. */
    if ( *test_str_p == '\0' && *prefix_p != '\0' )
    {
        return FCT_FALSE;
    }

    /* is_match will be set to the either FCT_TRUE if we kicked of the loop
    early because our filter ran out of characters or FCT_FALSE if we
    encountered a mismatch before our filter ran out of characters. */
    return is_match;
}